

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall
imrt::EvaluationFunction::undo_last_eval
          (EvaluationFunction *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *this_00;
  int o_00;
  int k_00;
  long lVar1;
  _List_node_base *p_Var2;
  int o;
  int k;
  
  this_00 = &this->Z_diff;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    o_00 = *(int *)&p_Var2[1]._M_next;
    k_00 = *(int *)((long)&p_Var2[1]._M_next + 4);
    lVar1 = *(long *)&(this->Z).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[o_00].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    *(double *)(lVar1 + (long)k_00 * 8) =
         *(double *)(lVar1 + (long)k_00 * 8) - (double)p_Var2[1]._M_prev;
    update_sorted_voxels(this,w,Zmin,Zmax,o_00,k_00);
  }
  this->F = this->prev_F;
  std::__cxx11::
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::clear(this_00);
  return;
}

Assistant:

void EvaluationFunction::undo_last_eval(vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax){

	for(auto z:Z_diff){
		int o=z.first.first;
		int k=z.first.second;
		Z[o][k]-=z.second;

		double prev_Dok=D[o][k];
		update_sorted_voxels(w, Zmin, Zmax, o, k);
		//update_beamlets_impact(o, k, prev_Dok);
	}
	F=prev_F;
	prev_F=F; Z_diff.clear();
}